

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebServer.cpp
# Opt level: O2

void __thiscall WebServer::connectionCallback(WebServer *this)

{
  HttpConnPool *this_00;
  Channel *this_01;
  __node_base this_02;
  int iVar1;
  char *pcVar2;
  _Bind<void_(HttpConn::*(std::shared_ptr<HttpConn>,_EventLoop_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int))(EventLoop_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int)>
  local_110;
  Functor local_c0;
  undefined1 local_a0 [8];
  string from;
  HttpConnPtr httpConn;
  undefined1 auStack_58 [8];
  sockaddr_in cliAddr;
  __node_base local_40;
  EventLoop *loop;
  socklen_t len;
  int connfd;
  
  auStack_58._0_2_ = 0;
  auStack_58[2] = '\0';
  auStack_58[3] = '\0';
  auStack_58[4] = '\0';
  auStack_58[5] = '\0';
  auStack_58[6] = '\0';
  auStack_58[7] = '\0';
  cliAddr.sin_family = 0;
  cliAddr.sin_port = 0;
  cliAddr.sin_addr.s_addr = 0;
  loop._4_4_ = 0;
  loop._0_4_ = 0x10;
  while( true ) {
    while( true ) {
      loop._4_4_ = accept(this->listenFd_,(sockaddr *)auStack_58,(socklen_t *)&loop);
      if (loop._4_4_ < 1) {
        this_01 = (this->acceptChannel_).super___shared_ptr<Channel,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        this_01->events_ = -0x7fffffff;
        Channel::update(this_01);
        return;
      }
      local_40._M_nxt =
           (_Hash_node_base *)
           EventLoopThreadPool::getNextLoop
                     ((this->reactorPool_)._M_t.
                      super___uniq_ptr_impl<EventLoopThreadPool,_std::default_delete<EventLoopThreadPool>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_EventLoopThreadPool_*,_std::default_delete<EventLoopThreadPool>_>
                      .super__Head_base<0UL,_EventLoopThreadPool_*,_false>._M_head_impl);
      if (loop._4_4_ < 100000) break;
      close(loop._4_4_);
    }
    pcVar2 = inet_ntoa((in_addr)auStack_58._4_4_);
    std::__cxx11::string::string((string *)local_a0,pcVar2,(allocator *)&local_110);
    std::__cxx11::string::push_back((char)(string *)local_a0);
    std::__cxx11::to_string
              ((string *)&local_110,
               (uint)(ushort)(auStack_58._2_2_ << 8 | (ushort)auStack_58._2_2_ >> 8));
    std::__cxx11::string::append((string *)local_a0);
    std::__cxx11::string::~string((string *)&local_110);
    iVar1 = setNonBlocking(loop._4_4_);
    if (iVar1 == -1) break;
    setNodelay(loop._4_4_);
    this_00 = (HttpConnPool *)((long)&from.field_2 + 8);
    HttpConnPool::getNextConn(this_00);
    this_02._M_nxt = local_40._M_nxt;
    httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)HttpConn::init;
    std::
    _Bind<void(HttpConn::*(std::shared_ptr<HttpConn>,EventLoop*,std::__cxx11::string,int))(EventLoop*,std::__cxx11::string,int)>
    ::_Bind<std::shared_ptr<HttpConn>&,EventLoop*&,std::__cxx11::string,int&>
              ((_Bind<void(HttpConn::*(std::shared_ptr<HttpConn>,EventLoop*,std::__cxx11::string,int))(EventLoop*,std::__cxx11::string,int)>
                *)&local_110,
               (offset_in_HttpConn_to_subr *)
               &httpConn.super___shared_ptr<HttpConn,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (shared_ptr<HttpConn> *)this_00,(EventLoop **)&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
               (int *)((long)&loop + 4));
    std::function<void()>::
    function<std::_Bind<void(HttpConn::*(std::shared_ptr<HttpConn>,EventLoop*,std::__cxx11::string,int))(EventLoop*,std::__cxx11::string,int)>,void>
              ((function<void()> *)&local_c0,&local_110);
    EventLoop::runInLoop((EventLoop *)this_02._M_nxt,&local_c0);
    std::_Function_base::~_Function_base(&local_c0.super__Function_base);
    std::
    _Tuple_impl<0UL,_std::shared_ptr<HttpConn>,_EventLoop_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~_Tuple_impl(&local_110._M_bound_args.
                    super__Tuple_impl<0UL,_std::shared_ptr<HttpConn>,_EventLoop_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                  );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&httpConn);
    std::__cxx11::string::~string((string *)local_a0);
  }
  __assert_fail("setNonBlocking(connfd) != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/WebServer.cpp"
                ,0x66,"void WebServer::connectionCallback()");
}

Assistant:

void WebServer::connectionCallback() {
    struct sockaddr_in cliAddr;
    memset(&cliAddr, 0, sizeof(struct sockaddr_in));
    socklen_t len = sizeof(cliAddr);
    int connfd = 0;
    while ((connfd = accept(listenFd_, (struct sockaddr*)&cliAddr, &len)) > 0) {
        EventLoop *loop = reactorPool_->getNextLoop();
        
        // LOG << "New connection from " << inet_ntoa(cliAddr.sin_addr) << ":" << ntohs(cliAddr.sin_port);
        
        if(connfd >= MAXFD) {
            close(connfd);
            continue;
        }
        std::string from(inet_ntoa(cliAddr.sin_addr));
        from.push_back(':');
        from += std::to_string(ntohs(cliAddr.sin_port));

        assert(setNonBlocking(connfd) != -1);
        setNodelay(connfd);
        HttpConnPtr httpConn = connPool_.getNextConn();
        loop->runInLoop(std::bind(&HttpConn::init, httpConn, loop, std::move(from), connfd));
    }

    acceptChannel_->setEvent(EPOLLIN | EPOLLET);
    acceptChannel_->update();
}